

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool GlobOpt::DoInlineArgsOpt(Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  Func *this;
  undefined4 *puVar3;
  bool local_1a;
  bool doInlineArgsOpt;
  Func *topFunc;
  Func *func_local;
  
  this = Func::GetTopFunc(func);
  if (this == func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d96,"(topFunc != func)","topFunc != func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  sourceContextId = Func::GetSourceContextId(this);
  functionId = Func::GetLocalFunctionId(this);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,InlineArgsOptPhase,sourceContextId,functionId);
  local_1a = false;
  if (!bVar2) {
    bVar2 = Func::GetHasCalls(func);
    local_1a = false;
    if (!bVar2) {
      bVar2 = Func::GetHasUnoptimizedArgumentsAccess(func);
      local_1a = false;
      if (!bVar2) {
        local_1a = (bool)((byte)(*(uint *)&func->field_0x240 >> 0xb) & 1);
      }
    }
  }
  return local_1a;
}

Assistant:

bool
GlobOpt::DoInlineArgsOpt(Func const * func)
{
    Func const * topFunc = func->GetTopFunc();
    Assert(topFunc != func);
    bool doInlineArgsOpt =
        !PHASE_OFF(Js::InlineArgsOptPhase, topFunc) &&
        !func->GetHasCalls() &&
        !func->GetHasUnoptimizedArgumentsAccess() &&
        func->m_canDoInlineArgsOpt;
    return doInlineArgsOpt;
}